

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O3

size_t __thiscall
Lodtalk::MethodAssembler::Assembler::addLiteralAlways(Assembler *this,Oop newLiteral)

{
  pointer pOVar1;
  pointer pOVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  VMContext *local_38;
  
  pOVar1 = (this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_40 = newLiteral.field_0;
  local_38 = getCurrentContext();
  OopRef::registerSelf((OopRef *)&local_40);
  std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::emplace_back<Lodtalk::OopRef>
            (&this->literals,(OopRef *)&local_40);
  OopRef::unregisterSelf((OopRef *)&local_40);
  return (long)pOVar2 - (long)pOVar1 >> 5;
}

Assistant:

size_t Assembler::addLiteralAlways(Oop newLiteral)
{
    auto ret = literals.size();
	literals.push_back(newLiteral);
	return ret;
}